

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

void __thiscall
icu_63::SimpleTimeZone::setEndRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t time,TimeMode mode,
          UErrorCode *status)

{
  this->endMonth = (int8_t)month;
  this->endDay = (int8_t)dayOfMonth;
  this->endDayOfWeek = '\0';
  this->endTime = time;
  this->endTimeMode = mode;
  decodeEndRule(this,status);
  this->transitionRulesInitialized = '\0';
  return;
}

Assistant:

void 
SimpleTimeZone::setEndRule(int32_t month, int32_t dayOfMonth, 
                           int32_t time, TimeMode mode, UErrorCode& status)
{
    setEndRule(month, dayOfMonth, 0, time, mode, status);
}